

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

LY_ERR rb_insert(lyd_node *node,rb_node **rbt,rb_node **rbn)

{
  LY_ERR ret__;
  LY_ERR LVar1;
  
  LVar1 = lyds_create_node(node,rbn);
  if (LVar1 == LY_SUCCESS) {
    rb_insert_node(rbt,*rbn,(ly_bool *)0x0);
  }
  return (uint)(LVar1 != LY_SUCCESS);
}

Assistant:

static LY_ERR
rb_insert(struct lyd_node *node, struct rb_node **rbt, struct rb_node **rbn)
{
    LY_ERR ret;

    /* create a new red-black node to which the @p node will be assigned */
    ret = lyds_create_node(node, rbn);
    LY_CHECK_RET(ret);

    /* insert red-black node with @p node to the Red-black tree */
    rb_insert_node(rbt, *rbn, NULL);

    return LY_SUCCESS;
}